

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.h
# Opt level: O0

size_t __thiscall std::hash<luna::Value>::operator()(hash<luna::Value> *this,Value *t)

{
  byte *in_RSI;
  double in_stack_ffffffffffffffd8;
  hash<double> *in_stack_ffffffffffffffe0;
  size_t local_8;
  
  switch(*(undefined4 *)(in_RSI + 8)) {
  case 0:
    local_8 = hash<int>::operator()((hash<int> *)&stack0xffffffffffffffe7,0);
    break;
  case 1:
    local_8 = hash<bool>::operator()((hash<bool> *)&stack0xffffffffffffffe6,(bool)(*in_RSI & 1));
    break;
  case 2:
    local_8 = hash<double>::operator()(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    break;
  default:
    local_8 = hash<void_*>::operator()((hash<void_*> *)&stack0xffffffffffffffde,*(void **)in_RSI);
    break;
  case 4:
    local_8 = hash<void_*>::operator()((hash<void_*> *)&stack0xffffffffffffffe4,*(void **)in_RSI);
    break;
  case 5:
    local_8 = hash<void_*>::operator()((hash<void_*> *)&stack0xffffffffffffffe3,*(void **)in_RSI);
    break;
  case 6:
    local_8 = hash<void_*>::operator()((hash<void_*> *)&stack0xffffffffffffffe2,*(void **)in_RSI);
    break;
  case 7:
    local_8 = hash<void_*>::operator()((hash<void_*> *)&stack0xffffffffffffffe1,*(void **)in_RSI);
    break;
  case 8:
    local_8 = hash<void_*>::operator()((hash<void_*> *)&stack0xffffffffffffffe0,*(void **)in_RSI);
    break;
  case 9:
    local_8 = hash<void_*>::operator()((hash<void_*> *)&stack0xffffffffffffffdf,*(void **)in_RSI);
  }
  return local_8;
}

Assistant:

size_t operator () (const luna::Value &t) const
        {
            switch (t.type_)
            {
                case luna::ValueT_Nil:
                    return hash<int>()(0);
                case luna::ValueT_Bool:
                    return hash<bool>()(t.bvalue_);
                case luna::ValueT_Number:
                    return hash<double>()(t.num_);
                case luna::ValueT_String:
                    return hash<void *>()(t.str_);
                case luna::ValueT_Closure:
                    return hash<void *>()(t.closure_);
                case luna::ValueT_Upvalue:
                    return hash<void *>()(t.upvalue_);
                case luna::ValueT_Table:
                    return hash<void *>()(t.table_);
                case luna::ValueT_UserData:
                    return hash<void *>()(t.user_data_);
                case luna::ValueT_CFunction:
                    return hash<void *>()(reinterpret_cast<void *>(t.cfunc_));
                default:
                    return hash<void *>()(t.obj_);
            }
        }